

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.cpp
# Opt level: O0

bool nodecpp::stack_info_impl::stackPointerToInfo(void *ptr,StackFrameInfo *info)

{
  bool bVar1;
  undefined1 local_30 [8];
  ModuleAndOffset mao;
  StackFrameInfo *info_local;
  void *ptr_local;
  
  mao.offsetInModule = (uintptr_t)info;
  bVar1 = addrToModuleAndOffset(ptr,(ModuleAndOffset *)local_30);
  if (bVar1) {
    *(void **)(mao.offsetInModule + 0x80) = ptr;
    *(char **)(mao.offsetInModule + 0x88) = mao.modulePath;
    std::__cxx11::
    basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
    ::operator=((basic_string<char,_std::char_traits<char>,_nodecpp::selective_allocator<nodecpp::StdRawAllocator,_char>_>
                 *)mao.offsetInModule,(char *)local_30);
    useAddr2Line((StackFrameInfo *)mao.offsetInModule);
  }
  return bVar1;
}

Assistant:

bool stackPointerToInfo( void* ptr, nodecpp::stack_info_impl::StackFrameInfo& info )
	{
	#if defined(NODECPP_WINDOWS)

		static constexpr size_t TRACE_MAX_FUNCTION_NAME_LENGTH = 1024;
		HANDLE process = GetCurrentProcess();
		uint8_t symbolBuff[ sizeof(SYMBOL_INFO) + (TRACE_MAX_FUNCTION_NAME_LENGTH - 1) * sizeof(TCHAR) ];
		SYMBOL_INFO *symbol = (SYMBOL_INFO *)symbolBuff;
		symbol->MaxNameLen = TRACE_MAX_FUNCTION_NAME_LENGTH;
		symbol->SizeOfStruct = sizeof(SYMBOL_INFO);
		DWORD displacement = 0;
		IMAGEHLP_LINE64 line;
		DWORD64 address = (DWORD64)(ptr);
		bool addrOK = false;
	#ifndef _DEBUG
		addrOK = SymFromAddr(process, address, NULL, symbol);
	#endif
		bool fileLineOK = SymGetLineFromAddr64(process, address, &displacement, &line);

		if ( fileLineOK )
		{
			info.srcPath = line.FileName;
			info.line = line.LineNumber;
		}
		if ( addrOK )
			info.functionName = symbol->Name;
		return true;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_GCC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_LINUX) && defined(NODECPP_CLANG)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: I see strange behaviour on clang on linux.
			// when we are the main executable, ptr returned by
			// backtrace is already an offset. But is an absolute
			// address when we are a dynamic load library
			info.offset = reinterpret_cast<uintptr_t>(ptr);
			info.offset2 = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			useAddr2Line( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_MAC)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;
			// mb: addr2line is not found on mac, use atos
			useAtos( info );
			return true;
		}
		else
			return false;

	#elif defined(NODECPP_ANDROID)

		nodecpp::stack_info_impl::ModuleAndOffset mao;
		if ( addrToModuleAndOffset( ptr, mao ) )
		{
			// mb: clang on android behaves as gcc on linux,
			// and not as clang on linux
			info.offset = mao.offsetInModule;
			info.modulePath = mao.modulePath;

			// mb: addr2line is not present on the device, is on the host where cross compile took place, i.e.
			// %ANDROID_HOME%\ndk\24.0.8215888\toolchains\llvm\prebuilt\windows-x86_64\bin\llvm-addr2line.exe
			// useAddr2Line( info );
			return true;
		}
		else
			return false;

	#else
	#error platform not (yet) supported, use NODECPP_NO_STACK_INFO_IN_EXCEPTIONS
	#endif // platform/compiler
	}